

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O2

void __thiscall ON_ThickeningUserData::SetToDefaults(ON_ThickeningUserData *this)

{
  int iVar1;
  undefined4 extraout_var;
  ON_XMLNode *pOVar2;
  ON_XMLParameters p;
  ON_XMLVariant local_170;
  ON_XMLProperty prop;
  
  (*(this->super_ON_XMLUserData).super_ON_UserData.super_ON_Object._vptr_ON_Object[0x24])();
  ON_XMLProperty::ON_XMLProperty(&prop);
  iVar1 = (*(this->super_ON_XMLUserData).super_ON_UserData.super_ON_Object._vptr_ON_Object[0x1f])
                    (this);
  pOVar2 = (ON_XMLNode *)operator_new(0xe8);
  ON_XMLNode::ON_XMLNode(pOVar2,L"thickening-object-data");
  pOVar2 = (ON_XMLNode *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
                     ((long *)CONCAT44(extraout_var,iVar1),pOVar2);
  ON_XMLParameters::ON_XMLParameters(&p,pOVar2);
  ::ON_XMLVariant::ON_XMLVariant(&local_170,false);
  ON_XMLParameters::SetParam(&p,L"on",&local_170);
  ::ON_XMLVariant::~ON_XMLVariant(&local_170);
  ::ON_XMLVariant::ON_XMLVariant(&local_170,true);
  ON_XMLParameters::SetParam(&p,L"solid",&local_170);
  ::ON_XMLVariant::~ON_XMLVariant(&local_170);
  ::ON_XMLVariant::ON_XMLVariant(&local_170,false);
  ON_XMLParameters::SetParam(&p,L"both-sides",&local_170);
  ::ON_XMLVariant::~ON_XMLVariant(&local_170);
  ::ON_XMLVariant::ON_XMLVariant(&local_170,false);
  ON_XMLParameters::SetParam(&p,L"offset-only",&local_170);
  ::ON_XMLVariant::~ON_XMLVariant(&local_170);
  ::ON_XMLVariant::ON_XMLVariant(&local_170,0.1);
  ON_XMLParameters::SetParam(&p,L"distance",&local_170);
  ::ON_XMLVariant::~ON_XMLVariant(&local_170);
  ON_XMLParameters::~ON_XMLParameters(&p);
  ON_XMLProperty::~ON_XMLProperty(&prop);
  return;
}

Assistant:

void ON_ThickeningUserData::SetToDefaults(void) const
{
  auto& ud = const_cast<ON_ThickeningUserData&>(*this);
  ud.Clear();

  ON_XMLProperty prop;
  ON_XMLNode* root = ud.XMLRootForWrite().AttachChildNode(new ON_XMLNode(ON_THICKENING_ROOT));

  ON_Thickening::Defaults d;

  ON_XMLParameters p(*root);
  p.SetParam(ON_THICKENING_ON, false);
  p.SetParam(ON_THICKENING_SOLID, d.Solid());
  p.SetParam(ON_THICKENING_BOTH_SIDES, d.BothSides());
  p.SetParam(ON_THICKENING_OFFSET_ONLY, d.OffsetOnly());
  p.SetParam(ON_THICKENING_DISTANCE, d.Distance());
}